

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O0

uint32_t GetFilterMap(uint8_t *alpha,int width,int height,int filter,int effort_level)

{
  int iVar1;
  WEBP_FILTER_TYPE WVar2;
  int in_ECX;
  int in_R8D;
  int num_colors;
  int kMaxColorsForFilterNone;
  int kMinColorsForFilterNone;
  int try_filter_none;
  uint32_t bit_map;
  int in_stack_000000e4;
  int in_stack_000000e8;
  int in_stack_000000ec;
  uint8_t *in_stack_000000f0;
  int in_stack_00000104;
  int in_stack_00000108;
  int in_stack_0000010c;
  uint8_t *in_stack_00000110;
  undefined1 local_30;
  undefined4 local_1c;
  
  if (in_ECX == 6) {
    iVar1 = GetNumColors(in_stack_000000f0,in_stack_000000ec,in_stack_000000e8,in_stack_000000e4);
    if (iVar1 < 0x11) {
      local_30 = 0;
    }
    else {
      WVar2 = WebPEstimateBestFilter
                        (in_stack_00000110,in_stack_0000010c,in_stack_00000108,in_stack_00000104);
      local_30 = (byte)WVar2;
    }
    local_1c = 1 << (local_30 & 0x1f);
    if ((3 < in_R8D) || (0xc0 < iVar1)) {
      local_1c = local_1c | 1;
    }
  }
  else if (in_ECX == 0) {
    local_1c = 1;
  }
  else {
    local_1c = 0xf;
  }
  return local_1c;
}

Assistant:

static uint32_t GetFilterMap(const uint8_t* alpha, int width, int height,
                             int filter, int effort_level) {
  uint32_t bit_map = 0U;
  if (filter == WEBP_FILTER_FAST) {
    // Quick estimate of the best candidate.
    int try_filter_none = (effort_level > 3);
    const int kMinColorsForFilterNone = 16;
    const int kMaxColorsForFilterNone = 192;
    const int num_colors = GetNumColors(alpha, width, height, width);
    // For low number of colors, NONE yields better compression.
    filter = (num_colors <= kMinColorsForFilterNone)
        ? WEBP_FILTER_NONE
        : WebPEstimateBestFilter(alpha, width, height, width);
    bit_map |= 1 << filter;
    // For large number of colors, try FILTER_NONE in addition to the best
    // filter as well.
    if (try_filter_none || num_colors > kMaxColorsForFilterNone) {
      bit_map |= FILTER_TRY_NONE;
    }
  } else if (filter == WEBP_FILTER_NONE) {
    bit_map = FILTER_TRY_NONE;
  } else {  // WEBP_FILTER_BEST -> try all
    bit_map = FILTER_TRY_ALL;
  }
  return bit_map;
}